

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ReturnStatement.h
# Opt level: O1

void __thiscall ReturnStatement::execute(ReturnStatement *this,Environment *env)

{
  element_type *peVar1;
  undefined8 *puVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__tmp;
  ptr<Value> toReturn;
  undefined8 local_18;
  long lStack_10;
  
  peVar1 = (this->expression).super___shared_ptr<Expression,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (peVar1 == (element_type *)0x0) {
    local_18 = 0;
    lStack_10 = 0;
  }
  else {
    (**peVar1->_vptr_Expression)(&local_18,peVar1,env);
  }
  puVar2 = (undefined8 *)__cxa_allocate_exception(0x10);
  if (lStack_10 != 0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      *(int *)(lStack_10 + 8) = *(int *)(lStack_10 + 8) + 1;
      UNLOCK();
    }
    else {
      *(int *)(lStack_10 + 8) = *(int *)(lStack_10 + 8) + 1;
    }
  }
  *puVar2 = local_18;
  puVar2[1] = lStack_10;
  __cxa_throw(puVar2,&ReturnPacket::typeinfo,CarrierPacket::~CarrierPacket);
}

Assistant:

void execute(Environment *env) override {
        ptr<Value> toReturn = expression ? expression->evaluate(env) : nullptr;
        throw ReturnPacket(toReturn);
    }